

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

void __thiscall OB::Parg::set(Parg *this,string *_name,string *_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *pmVar1;
  pointer pcVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  string _short;
  string delim;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  stringstream out;
  key_type local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,",","");
  lVar3 = std::__cxx11::string::find((char *)_name,(ulong)local_290,0);
  if (lVar3 == -1) {
    pmVar1 = &this->data_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    pmVar5->mode_ = true;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    std::__cxx11::string::_M_replace
              ((ulong)&pmVar5->value_,0,(char *)(pmVar5->value_)._M_string_length,0x12a00d);
    std::operator+(&local_2d0,"  --",_name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1a8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1a8[0]._8_8_ = plVar6[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1b8 + 0x10);
    }
    else {
      local_1a8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_1b8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->modes_,local_1b8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_00106ee7;
    uVar10 = CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                      local_2d0.field_2._M_local_buf[0]);
    _Var11._M_p = local_2d0._M_dataplus._M_p;
  }
  else {
    local_1b8._8_8_ = 0;
    local_1a8[0]._M_allocated_capacity = local_1a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_2d0._M_string_length = 0;
    local_2d0.field_2._M_local_buf[0] = '\0';
    pcVar2 = (_name->_M_dataplus)._M_p;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_1b8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + _name->_M_string_length);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_290,local_288 + (long)local_290);
    delimit(&local_270,this,&local_1f8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((local_270.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         local_270.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (0x40 < (ulong)((long)local_270.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_270.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      __assert_fail("names.size() >= 1 && names.size() <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/parg.hh"
                    ,0xaf,"void OB::Parg::set(std::string, std::string)");
    }
    std::__cxx11::string::_M_assign((string *)local_1b8);
    if ((long)local_270.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_270.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if (local_270.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 1) {
        __assert_fail("names.at(1).size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/parg.hh"
                      ,0xb6,"void OB::Parg::set(std::string, std::string)");
      }
      std::__cxx11::string::_M_assign((string *)&local_2d0);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->flags_,&local_2d0);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar1 = &this->data_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    pmVar5->mode_ = true;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_replace
              ((ulong)&pmVar5->value_,0,(char *)(pmVar5->value_)._M_string_length,0x12a00d);
    std::operator+(&local_1d8,"  -",&local_2d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_248 = *plVar8;
      lStack_240 = plVar6[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *plVar8;
      local_258 = (long *)*plVar6;
    }
    local_250 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_258,local_1b8._0_8_);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_228 = *plVar8;
      lStack_220 = plVar6[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar8;
      local_238 = (long *)*plVar6;
    }
    local_230 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_2a0 = *plVar8;
      lStack_298 = plVar6[3];
      local_2b0 = &local_2a0;
    }
    else {
      local_2a0 = *plVar8;
      local_2b0 = (long *)*plVar6;
    }
    local_2a8 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_2b0);
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                               local_2d0.field_2._M_local_buf[0]) + 1);
    }
    uVar10 = local_1a8[0]._M_allocated_capacity;
    _Var11._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) goto LAB_00106ee7;
  }
  operator_delete(_Var11._M_p,uVar10 + 1);
LAB_00106ee7:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b8 + 0x10),(_info->_M_dataplus)._M_p,
                      _info->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_2d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,
                    CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                             local_2d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  return;
}

Assistant:

void set(std::string _name, std::string _info)
  {
    // sets a flag
    std::string delim {","};
    if (_name.find(delim) != std::string::npos)
    {
      bool has_short {false};
      std::string _long;
      std::string _short;

      auto const names = delimit(_name, delim);
      assert(names.size() >= 1 && names.size() <= 2);
      _long = names.at(0);

      if (names.size() == 2) has_short = true;
      if (has_short)
      {
        // short name must be one char
        assert(names.at(1).size() == 1);
        _short = names.at(1);
      }

      flags_[_short] = _long;
      data_[_long].long_ = _long;
      data_[_long].short_ = _short;
      data_[_long].mode_ = true;
      data_[_long].value_ = "0";
      modes_.append("  -" + _short + ", --" + _long + "\n");
    }
    else
    {
      data_[_name].long_ = _name;
      data_[_name].mode_ = true;
      data_[_name].value_ = "0";
      modes_.append("  --" + _name + "\n");
    }

    std::stringstream out;
    out << "    " << _info << "\n";
    modes_.append(out.str());
  }